

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdSetTapScriptByWitnessStack
              (void *handle,void *tree_handle,char *control_block,char *tapscript,
              char **internal_pubkey)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  ByteData256 *node;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range2;
  TaprootScriptTree new_tree;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  Script tapscript_obj;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  SchnorrPubkey internal_pubkey_obj;
  uint8_t leaf_version;
  value_type *tree;
  CfdCapiTapscriptTree *buffer;
  char *work_internal_pubkey;
  int result;
  size_type in_stack_fffffffffffffc98;
  Script *tapscript_00;
  vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
  *in_stack_fffffffffffffca0;
  TaprootScriptTree *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcb0;
  CfdError in_stack_fffffffffffffcbc;
  CfdException *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffd00;
  allocator *paVar3;
  string local_2b8;
  reference local_298;
  ByteData256 *local_290;
  __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
  local_288;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_280;
  string *in_stack_fffffffffffffda8;
  pointer in_stack_fffffffffffffdb0;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_190;
  Script local_178;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_140;
  SchnorrPubkey local_128;
  uint8_t local_109;
  reference local_108;
  long local_100;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  allocator local_71;
  string local_70 [48];
  char *local_40;
  undefined4 local_34;
  undefined8 *local_30;
  char *local_28;
  char *local_20;
  long local_18;
  int local_4;
  
  local_34 = 0xffffffff;
  local_40 = (char *)0x0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"TapscriptTree",&local_71);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x2c0;
    local_90.funcname = "CfdSetTapScriptByWitnessStack";
    cfd::core::logger::warn<>(&local_90,"control_block is null or empty.");
    local_b2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,"Failed to parameter. control_block is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb0);
    local_b2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (!bVar1) {
    local_100 = local_18;
    local_108 = std::
                vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                ::at(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    local_109 = '\0';
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_128);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector(&local_140)
    ;
    cfd::core::Script::Script(&local_178);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&local_190);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,local_28,&local_1b1);
    std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
    emplace_back<std::__cxx11::string>
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,local_20,&local_1d9);
    std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
    emplace_back<std::__cxx11::string>
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    tapscript_00 = &local_178;
    this = (TaprootScriptTree *)0x0;
    cfd::core::TaprootUtil::ParseTaprootSignData
              (&local_190,(SchnorrSignature *)0x0,(bool *)0x0,&local_109,&local_128,&local_140,
               tapscript_00,(vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0
               ,(ByteData *)0x0);
    cfd::core::TaprootScriptTree::TaprootScriptTree
              ((TaprootScriptTree *)&stack0xfffffffffffffd88,local_109,&local_178,
               *(NetType *)(local_100 + 0x20));
    local_280 = &local_140;
    local_288._M_current =
         (ByteData256 *)
         std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::begin
                   ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                    tapscript_00);
    local_290 = (ByteData256 *)
                std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
                          ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                            *)tapscript_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                          *)this,(__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                  *)tapscript_00);
      if (!bVar1) break;
      local_298 = __gnu_cxx::
                  __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                  ::operator*(&local_288);
      cfd::core::TaprootScriptTree::AddBranch
                ((TaprootScriptTree *)&stack0xfffffffffffffd88,local_298);
      __gnu_cxx::
      __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
      ::operator++(&local_288);
    }
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_2b8,&local_128);
      local_40 = cfd::capi::CreateString(in_stack_fffffffffffffd00);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    cfd::core::TaprootScriptTree::operator=(local_108,(TaprootScriptTree *)&stack0xfffffffffffffd88)
    ;
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::clear
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)0x5c913c);
    if (local_30 != (undefined8 *)0x0) {
      *local_30 = local_40;
    }
    local_4 = 0;
    cfd::core::TaprootScriptTree::~TaprootScriptTree(this);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_fffffffffffffcb0);
    cfd::core::Script::~Script((Script *)this);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               in_stack_fffffffffffffcb0);
    cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x5c91a6);
    return local_4;
  }
  local_d0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_script.cpp"
               ,0x2f);
  local_d0.filename = local_d0.filename + 1;
  local_d0.line = 0x2c6;
  local_d0.funcname = "CfdSetTapScriptByWitnessStack";
  cfd::core::logger::warn<>(&local_d0,"tapscript is null or empty.");
  local_f2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  paVar3 = &local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Failed to parameter. tapscript is null or empty.",paVar3);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb0);
  local_f2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetTapScriptByWitnessStack(
    void* handle, void* tree_handle, const char* control_block,
    const char* tapscript, char** internal_pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_internal_pubkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(control_block)) {
      warn(CFD_LOG_SOURCE, "control_block is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. control_block is null or empty.");
    }
    if (IsEmptyString(tapscript)) {
      warn(CFD_LOG_SOURCE, "tapscript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tapscript is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    auto& tree = buffer->tree_buffer->at(0);

    uint8_t leaf_version = 0;
    SchnorrPubkey internal_pubkey_obj;
    std::vector<ByteData256> nodes;
    Script tapscript_obj;
    std::vector<ByteData> witness_stack;
    witness_stack.emplace_back(std::string(tapscript));
    witness_stack.emplace_back(std::string(control_block));
    TaprootUtil::ParseTaprootSignData(
        witness_stack, nullptr, nullptr, &leaf_version, &internal_pubkey_obj,
        &nodes, &tapscript_obj);
    TaprootScriptTree new_tree(leaf_version, tapscript_obj, buffer->net_type);
    for (const auto& node : nodes) new_tree.AddBranch(node);

    if (internal_pubkey != nullptr) {
      work_internal_pubkey = CreateString(internal_pubkey_obj.GetHex());
    }

    tree = new_tree;
    buffer->branch_buffer->clear();
    if (internal_pubkey != nullptr) *internal_pubkey = work_internal_pubkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_internal_pubkey);
  return result;
}